

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall spirv_cross::Compiler::is_immutable(Compiler *this,uint32_t id)

{
  bool bVar1;
  SPIRVariable *pSVar2;
  SPIRAccessChain *pSVar3;
  SPIRExpression *pSVar4;
  undefined1 uVar5;
  
  uVar5 = 1;
  switch((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr[id].type) {
  case TypeVariable:
    pSVar2 = get<spirv_cross::SPIRVariable>(this,id);
    if ((pSVar2->storage != StorageClassUniformConstant) && (pSVar2->phi_variable == false)) {
      bVar1 = expression_is_lvalue(this,id);
      uVar5 = !bVar1;
    }
    break;
  case TypeConstant:
  case TypeConstantOp:
  case TypeUndef:
    break;
  default:
    uVar5 = 0;
    break;
  case TypeExpression:
    pSVar4 = get<spirv_cross::SPIRExpression>(this,id);
    uVar5 = pSVar4->immutable;
    break;
  case TypeAccessChain:
    pSVar3 = get<spirv_cross::SPIRAccessChain>(this,id);
    uVar5 = pSVar3->immutable;
  }
  return (bool)uVar5;
}

Assistant:

bool Compiler::is_immutable(uint32_t id) const
{
	if (ir.ids[id].get_type() == TypeVariable)
	{
		auto &var = get<SPIRVariable>(id);

		// Anything we load from the UniformConstant address space is guaranteed to be immutable.
		bool pointer_to_const = var.storage == StorageClassUniformConstant;
		return pointer_to_const || var.phi_variable || !expression_is_lvalue(id);
	}
	else if (ir.ids[id].get_type() == TypeAccessChain)
		return get<SPIRAccessChain>(id).immutable;
	else if (ir.ids[id].get_type() == TypeExpression)
		return get<SPIRExpression>(id).immutable;
	else if (ir.ids[id].get_type() == TypeConstant || ir.ids[id].get_type() == TypeConstantOp ||
	         ir.ids[id].get_type() == TypeUndef)
		return true;
	else
		return false;
}